

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void __thiscall
duckdb::HistogramBinState<bool>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<bool> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  size_type __n;
  sel_t *psVar1;
  long lVar2;
  uint uVar3;
  unsafe_vector<bool> *puVar4;
  unsafe_vector<idx_t> *puVar5;
  Vector *this_00;
  idx_t count_00;
  ulong uVar6;
  ulong uVar7;
  BinderException *pBVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  vector<bool,_std::allocator<bool>_> *this_01;
  ulong uVar12;
  size_type sVar13;
  long lVar14;
  iterator __position;
  UnifiedVectorFormat bin_child_data;
  UnifiedVectorFormat bin_data;
  undefined1 local_e0 [16];
  SelectionVector local_d0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_98;
  UnifiedVectorFormat local_78;
  
  puVar4 = (unsafe_vector<bool> *)operator_new(0x28);
  (puVar4->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = 0;
  *(undefined8 *)
   ((long)&(puVar4->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 8) = 0;
  (puVar4->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   ((long)&(puVar4->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base + 8) = 0;
  (puVar4->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  this->bin_boundaries = puVar4;
  puVar5 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar5;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(bin_vector,count,&local_78);
  if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
    pos = (idx_t)(local_78.sel)->sel_vector[pos];
  }
  uVar12 = *(ulong *)(local_78.data + pos * 0x10);
  __n = *(size_type *)(local_78.data + pos * 0x10 + 8);
  if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
       (unsigned_long *)0x0) &&
     ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[pos >> 6] >>
       (pos & 0x3f) & 1) == 0)) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    local_e0._0_8_ = local_d0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"Histogram bin list cannot be NULL","");
    BinderException::BinderException(pBVar8,(string *)local_e0);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = ListVector::GetEntry(bin_vector);
  count_00 = ListVector::GetListSize(bin_vector);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_e0);
  Vector::ToUnifiedFormat(this_00,count_00,(UnifiedVectorFormat *)local_e0);
  ::std::vector<bool,_std::allocator<bool>_>::reserve
            ((vector<bool,_std::allocator<bool>_> *)this->bin_boundaries,__n);
  sVar13 = __n;
  while( true ) {
    if (sVar13 == 0) {
      this_01 = (vector<bool,_std::allocator<bool>_> *)this->bin_boundaries;
      lVar10 = *(long *)this_01;
      lVar14 = *(long *)(this_01 + 0x10);
      uVar3 = *(uint *)(this_01 + 0x18);
      if (uVar3 == 0 && lVar10 == lVar14) {
        uVar3 = 0;
        lVar14 = lVar10;
      }
      else {
        uVar12 = (lVar14 - lVar10) * 8 + (ulong)uVar3;
        lVar2 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        ::std::__introsort_loop<std::_Bit_iterator,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar10,0,lVar14,(ulong)uVar3,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
        ::std::__final_insertion_sort<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar10,0,lVar14,uVar3);
        this_01 = (vector<bool,_std::allocator<bool>_> *)this->bin_boundaries;
        lVar10 = *(long *)(this_01 + 0x10);
        uVar3 = *(uint *)(this_01 + 0x18);
        lVar14 = *(long *)this_01;
      }
      if (1 < (ulong)uVar3 + (lVar10 - lVar14) * 8) {
        uVar12 = 1;
        do {
          uVar9 = uVar12 - 1;
          uVar6 = uVar12 + 0x3e;
          if (-1 < (long)uVar9) {
            uVar6 = uVar9;
          }
          uVar11 = uVar12 + 0x3f;
          if (-1 < (long)uVar12) {
            uVar11 = uVar12;
          }
          uVar7 = (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001);
          lVar10 = lVar14 + ((long)uVar11 >> 6) * 8;
          if (((*(ulong *)(lVar14 + ((long)uVar6 >> 6) * 8 + -8 +
                          (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                (uVar9 & 0x3f) & 1) != 0) !=
              ((*(ulong *)(lVar10 + -8 + uVar7 * 8) >> (uVar12 & 0x3f) & 1) == 0)) {
            __position.super__Bit_iterator_base._M_p = lVar10 + uVar7 * 8 + -8;
            __position.super__Bit_iterator_base._M_offset = (uint)uVar12 & 0x3f;
            __position.super__Bit_iterator_base._12_4_ = 0;
            ::std::vector<bool,_std::allocator<bool>_>::_M_erase(this_01,__position);
            this_01 = (vector<bool,_std::allocator<bool>_> *)this->bin_boundaries;
            lVar14 = *(long *)this_01;
            uVar12 = uVar9;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)*(uint *)(this_01 + 0x18) +
                          (*(long *)(this_01 + 0x10) - lVar14) * 8);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->counts,__n + 1);
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      }
      if (local_d0[0].selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0[0].selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    psVar1 = ((SelectionVector *)local_e0._0_8_)->sel_vector;
    uVar9 = uVar12;
    if (psVar1 != (sel_t *)0x0) {
      uVar9 = (ulong)psVar1[uVar12];
    }
    if (((unsigned_long *)local_d0[0].sel_vector != (unsigned_long *)0x0) &&
       ((*(ulong *)((long)local_d0[0].sel_vector + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) == 0))
    break;
    uVar9 = uVar12;
    if (psVar1 != (sel_t *)0x0) {
      uVar9 = (ulong)psVar1[uVar12];
    }
    ::std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)this->bin_boundaries,
               *(bool *)(local_e0._8_8_ + uVar9));
    uVar12 = uVar12 + 1;
    sVar13 = sVar13 - 1;
  }
  pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Histogram bin entry cannot be NULL","");
  BinderException::BinderException(pBVar8,&local_98);
  __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}